

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zeDeviceReleaseExternalSemaphoreExt(ze_external_semaphore_ext_handle_t hSemaphore)

{
  ze_result_t zVar1;
  
  if (DAT_0010e258 != (code *)0x0) {
    zVar1 = (*DAT_0010e258)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceReleaseExternalSemaphoreExt(
        ze_external_semaphore_ext_handle_t hSemaphore   ///< [in] The handle of the external semaphore.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnReleaseExternalSemaphoreExt = context.zeDdiTable.Device.pfnReleaseExternalSemaphoreExt;
        if( nullptr != pfnReleaseExternalSemaphoreExt )
        {
            result = pfnReleaseExternalSemaphoreExt( hSemaphore );
        }
        else
        {
            // generic implementation
        }

        return result;
    }